

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O1

void pinger_on_connect(uv_connect_t *req,int status)

{
  pinger_t *pinger;
  int iVar1;
  undefined8 *puVar2;
  void *pvVar3;
  undefined8 *extraout_RDX;
  undefined8 uVar4;
  undefined8 *__size;
  long *plVar5;
  char *pcVar6;
  long lVar7;
  undefined1 auVar8 [16];
  int64_t eval_b;
  int64_t eval_a;
  undefined8 uStack_b0;
  long lStack_a8;
  undefined1 aauStack_a0 [5] [16];
  uv_connect_t *puStack_48;
  pinger_t *ppStack_40;
  long local_18;
  
  pinger = (pinger_t *)req->handle->data;
  pinger_on_connect_count = pinger_on_connect_count + 1;
  local_18 = (long)status;
  if (local_18 == 0) {
    local_18 = 1;
    iVar1 = uv_is_readable();
    if (local_18 != iVar1) goto LAB_001afa1a;
    local_18 = 1;
    iVar1 = uv_is_writable(req->handle);
    if (local_18 != iVar1) goto LAB_001afa29;
    iVar1 = uv_is_closing(req->handle);
    local_18 = (long)iVar1;
    if (local_18 == 0) {
      pinger_write_ping(pinger);
      iVar1 = uv_read_start(req->handle,alloc_cb,pinger_read_cb);
      local_18 = (long)iVar1;
      if (local_18 == 0) {
        return;
      }
      goto LAB_001afa47;
    }
  }
  else {
    pinger_on_connect_cold_1();
LAB_001afa1a:
    pinger_on_connect_cold_2();
LAB_001afa29:
    pinger_on_connect_cold_3();
  }
  pinger_on_connect_cold_4();
LAB_001afa47:
  plVar5 = &local_18;
  pinger_on_connect_cold_5();
  __size = &uStack_b0;
  puStack_48 = req;
  ppStack_40 = pinger;
  if ((int)*plVar5 == 0) {
    aauStack_a0[0] = uv_buf_init(PING,5);
    uVar4 = 1;
  }
  else {
    pcVar6 = PING;
    lVar7 = 8;
    do {
      auVar8 = uv_buf_init(pcVar6,1);
      *(long *)(aauStack_a0[-1] + lVar7 + 8) = auVar8._0_8_;
      *(long *)(aauStack_a0[0] + lVar7) = auVar8._8_8_;
      pcVar6 = pcVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x58);
    uVar4 = 5;
  }
  puVar2 = (undefined8 *)malloc(200);
  if (puVar2 == (undefined8 *)0x0) {
    pinger_write_ping_cold_2();
  }
  else {
    *puVar2 = 0;
    iVar1 = uv_write(puVar2,plVar5 + 2,aauStack_a0,uVar4,pinger_after_write);
    lStack_a8 = (long)iVar1;
    uStack_b0 = 0;
    if (lStack_a8 == 0) {
      puts("PING");
      return;
    }
  }
  pinger_write_ping_cold_1();
  pvVar3 = malloc((size_t)__size);
  *extraout_RDX = pvVar3;
  extraout_RDX[1] = __size;
  return;
}

Assistant:

static void pinger_on_connect(uv_connect_t* req, int status) {
  pinger_t* pinger = (pinger_t*) req->handle->data;

  pinger_on_connect_count++;

  ASSERT_OK(status);

  ASSERT_EQ(1, uv_is_readable(req->handle));
  ASSERT_EQ(1, uv_is_writable(req->handle));
  ASSERT_OK(uv_is_closing((uv_handle_t *) req->handle));

  pinger_write_ping(pinger);

  ASSERT_OK(uv_read_start((uv_stream_t*) req->handle,
                          alloc_cb,
                          pinger_read_cb));
}